

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O1

uint32_t icu_63::GreekUpper::getLetterData(UChar32 c)

{
  uint uVar1;
  
  if (c - 0x400U < 0x1b00 || c - 0x2127U < 0xffffe249) {
    uVar1 = 0;
  }
  else if (c < 0x400) {
    uVar1 = (uint)*(ushort *)(data0370 + (ulong)(c - 0x370) * 2);
  }
  else if (c < 0x2000) {
    uVar1 = (uint)*(ushort *)((long)&switchD_002dc590::switchdataD_00362840 + (long)c * 2);
  }
  else {
    uVar1 = 0x13a9;
    if (c != 0x2126) {
      uVar1 = 0;
    }
  }
  return uVar1;
}

Assistant:

uint32_t getLetterData(UChar32 c) {
    if (c < 0x370 || 0x2126 < c || (0x3ff < c && c < 0x1f00)) {
        return 0;
    } else if (c <= 0x3ff) {
        return data0370[c - 0x370];
    } else if (c <= 0x1fff) {
        return data1F00[c - 0x1f00];
    } else if (c == 0x2126) {
        return data2126;
    } else {
        return 0;
    }
}